

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O3

int b_array::first_ge<Map::Pair<std::__cxx11::string,unsigned_long>>
              (Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
               *data,size_t size,
              Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
              *entry)

{
  int iVar1;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *pPVar2;
  size_t index;
  bool bVar3;
  
  if (size != 0) {
    bVar3 = true;
    index = 0;
    do {
      pPVar2 = Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
               ::operator[](data,index);
      iVar1 = std::__cxx11::string::compare((string *)pPVar2);
      if (-1 < iVar1) {
        if (bVar3) {
          size = index;
        }
        break;
      }
      index = index + 1;
      bVar3 = index < size;
    } while (index != size);
  }
  return (int)size;
}

Assistant:

int first_ge(const b_array::Array<T>& data, size_t size, const T& entry) {
    for (size_t i = 0; i < size; i++) {
        if (data[i] >= entry) {
            return i;
        }
    }
    return size;
}